

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::JsonCodec::handleByAnnotation(JsonCodec *this,Schema schema)

{
  RemoveConst<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
  **ppRVar1;
  Impl *pIVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  RemoveConst<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
  *pRVar5;
  SegmentReader *pSVar6;
  CapTableReader *pCVar7;
  CapTableReader *pCVar8;
  void *pvVar9;
  short sVar10;
  anon_union_8_2_eba6ea51_for_Type_5 aVar11;
  StructSchema schema_00;
  size_t sVar12;
  SegmentReader *pSVar13;
  Type type;
  ArrayPtr<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry> table;
  Type type_00;
  Vector<capnp::Schema> dependencies;
  EnumSchema enumSchema;
  Schema local_b0;
  Reader local_a8;
  anon_union_8_2_eba6ea51_for_Type_5 local_78;
  Maybe<kj::StringPtr> local_70;
  Maybe<capnp::json::DiscriminatorOptions::Reader> local_58;
  
  local_b0.raw = schema.raw;
  Schema::getProto(&local_a8,&local_b0);
  if (local_a8._reader.dataSize < 0x70) {
    sVar10 = 0;
  }
  else {
    sVar10 = *(short *)((long)local_a8._reader.data + 0xc);
  }
  if (sVar10 == 2) {
    local_78 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum(&local_b0);
    pIVar2 = (this->impl).ptr;
    pEVar3 = (pIVar2->annotatedEnumHandlers).table.rows.builder.ptr;
    sVar12 = (long)(pIVar2->annotatedEnumHandlers).table.rows.builder.pos - (long)pEVar3 >> 5;
    table.size_ = (size_t)pEVar3;
    table.ptr = (Entry *)&(pIVar2->annotatedEnumHandlers).table.indexes;
    kj::
    HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>::
    insert<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Entry,capnp::EnumSchema&>
              ((HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
                *)&local_a8,table,sVar12,(EnumSchema *)sVar12);
    if (local_a8._reader.segment._0_1_ ==
        (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
         )0x0) {
      kj::heap<capnp::JsonCodec::AnnotatedEnumHandler,capnp::EnumSchema&>
                ((kj *)&local_a8,(EnumSchema *)&local_78);
      type_00.field_4.schema = local_78.schema;
      type_00.baseType = ENUM;
      type_00.listDepth = '\0';
      type_00.isImplicitParam = false;
      type_00.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      type_00._6_2_ = 0;
      addTypeHandlerImpl(this,type_00,(HandlerBase *)local_a8._reader.capTable);
      aVar11 = local_78;
      pEVar3 = (pIVar2->annotatedEnumHandlers).table.rows.builder.endPtr;
      if ((pIVar2->annotatedEnumHandlers).table.rows.builder.pos == pEVar3) {
        pEVar4 = (pIVar2->annotatedEnumHandlers).table.rows.builder.ptr;
        sVar12 = 4;
        if (pEVar3 != pEVar4) {
          sVar12 = (long)pEVar3 - (long)pEVar4 >> 4;
        }
        kj::
        Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>::
        setCapacity((Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
                     *)&pIVar2->annotatedEnumHandlers,sVar12);
      }
      pRVar5 = (pIVar2->annotatedEnumHandlers).table.rows.builder.pos;
      (pRVar5->key).baseType = ENUM;
      (pRVar5->key).listDepth = '\0';
      (pRVar5->key).field_4.schema = (RawBrandedSchema *)aVar11;
      (pRVar5->value).disposer = (Disposer *)local_a8._reader.segment;
      (pRVar5->value).ptr = (AnnotatedEnumHandler *)local_a8._reader.capTable;
      ppRVar1 = &(pIVar2->annotatedEnumHandlers).table.rows.builder.pos;
      *ppRVar1 = *ppRVar1 + 1;
    }
  }
  else if (sVar10 == 1) {
    Schema::getProto(&local_a8,&local_b0);
    if ((local_a8._reader.dataSize < 0x40) || (*local_a8._reader.data != -0x5c0587ba06e6227d)) {
      local_a8._reader.segment = (SegmentReader *)0x0;
      local_a8._reader.capTable = (CapTableReader *)0x0;
      local_a8._reader.data = (void *)0x0;
      schema_00 = Schema::asStruct(&local_b0);
      local_58.ptr.isSet = false;
      local_70.ptr.isSet = false;
      loadAnnotatedHandler(this,schema_00,&local_58,&local_70,(Vector<capnp::Schema> *)&local_a8);
      pCVar7 = local_a8._reader.capTable;
      for (pSVar13 = local_a8._reader.segment; pvVar9 = local_a8._reader.data,
          pCVar8 = local_a8._reader.capTable, pSVar6 = local_a8._reader.segment,
          pSVar13 != (SegmentReader *)pCVar7; pSVar13 = (SegmentReader *)&pSVar13->id) {
        handleByAnnotation(this,(RawBrandedSchema *)pSVar13->arena);
      }
      if (local_a8._reader.segment != (SegmentReader *)0x0) {
        local_a8._reader.segment = (SegmentReader *)0x0;
        local_a8._reader.capTable = (CapTableReader *)0x0;
        local_a8._reader.data = (void *)0x0;
        (**(code **)*local_a8._reader.pointers)
                  (local_a8._reader.pointers,pSVar6,8,(long)pCVar8 - (long)pSVar6 >> 3,
                   (long)pvVar9 - (long)pSVar6 >> 3,0);
      }
    }
    else {
      aVar11 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct(&local_b0);
      type.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)
                     (anon_union_8_2_eba6ea51_for_Type_5)aVar11.schema;
      type.baseType = STRUCT;
      type.listDepth = '\0';
      type.isImplicitParam = false;
      type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      type._6_2_ = 0;
      addTypeHandlerImpl(this,type,(HandlerBase *)&handleByAnnotation::GLOBAL_HANDLER);
    }
  }
  return;
}

Assistant:

void JsonCodec::handleByAnnotation(Schema schema) {
  switch (schema.getProto().which()) {
    case schema::Node::STRUCT: {
      if (schema.getProto().getId() == capnp::typeId<JsonValue>()) {
        // Special handler for JsonValue.
        static JsonValueHandler GLOBAL_HANDLER;
        addTypeHandler(schema.asStruct(), GLOBAL_HANDLER);
      } else {
        kj::Vector<Schema> dependencies;
        loadAnnotatedHandler(schema.asStruct(), nullptr, nullptr, dependencies);
        for (auto dep: dependencies) {
          handleByAnnotation(dep);
        }
      }
      break;
    }
    case schema::Node::ENUM: {
      auto enumSchema = schema.asEnum();
      impl->annotatedEnumHandlers.findOrCreate(enumSchema, [&]() {
        auto handler = kj::heap<AnnotatedEnumHandler>(enumSchema);
        addTypeHandler(enumSchema, *handler);
        return kj::HashMap<Type, kj::Own<AnnotatedEnumHandler>>::Entry {
            enumSchema, kj::mv(handler) };
      });
      break;
    }
    default:
      break;
  }
}